

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O2

void __thiscall cppcms::http::impl::file_buffer::name(file_buffer *this,string *n)

{
  logic_error *this_00;
  allocator local_39;
  string local_38;
  
  if (this->in_memory_ != false) {
    std::__cxx11::string::_M_assign((string *)&this->name_);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"File name updated on open file",&local_39);
  booster::logic_error::logic_error(this_00,&local_38);
  __cxa_throw(this_00,&booster::logic_error::typeinfo,booster::logic_error::~logic_error);
}

Assistant:

void name(std::string const &n)
	{
		if(!in_memory_)
			throw booster::logic_error("File name updated on open file");
		name_ = n;
	}